

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

bool __thiscall
andres::
BinaryViewExpressionScalarFirst<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Times<float,float,float>>
::overlaps<float,false,std::allocator<unsigned_long>>
          (BinaryViewExpressionScalarFirst<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Times<float,float,float>>
           *this,View<float,_false,_std::allocator<unsigned_long>_> *v)

{
  bool bVar1;
  View<float,_false,_std::allocator<unsigned_long>_> *v_local;
  BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Times<float,_float,_float>_>
  *this_local;
  
  bVar1 = View<float,true,std::allocator<unsigned_long>>::
          overlaps<float,false,std::allocator<unsigned_long>>
                    (*(View<float,true,std::allocator<unsigned_long>> **)this,v);
  return bVar1;
}

Assistant:

bool overlaps(const View<Tv, isConst, A>& v) const
            { return e_.overlaps(v); }